

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  ushort uVar1;
  loc lVar2;
  loc_conflict grid_00;
  loc_conflict grid_01;
  bool bVar3;
  player *p;
  _Bool _Var4;
  uint32_t uVar5;
  monster *pmVar7;
  loc_conflict lVar8;
  wchar_t wVar6;
  loc lVar9;
  monster_conflict *pmVar10;
  square_conflict *psVar11;
  int type;
  bool bVar12;
  bool bVar13;
  uint local_bc;
  int local_b8;
  wchar_t local_b4;
  wchar_t local_b0;
  wchar_t local_ac;
  bool local_a5;
  uint local_a4;
  jumps *next_2;
  jumps *next_1;
  monster *mon_1;
  jumps *next;
  jumps *new;
  wchar_t score;
  wchar_t d;
  wchar_t horizontal;
  wchar_t vertical;
  monster *mon;
  loc_conflict decoy;
  monster *t_mon;
  int local_48;
  _Bool is_player;
  _Bool hostile;
  uint32_t uStack_44;
  _Bool only_vault_grids_possible;
  wchar_t current_score;
  wchar_t num_spots;
  jumps *spots;
  wchar_t wStack_30;
  loc_conflict grid;
  wchar_t pick;
  wchar_t perc;
  wchar_t dis;
  loc_conflict start;
  effect_handler_context_t_conflict *context_local;
  
  _perc = (loc_conflict)loc(context->x,context->y);
  pick = (context->value).base;
  wVar6 = (context->value).m_bonus;
  current_score = 0;
  num_spots = 0;
  uStack_44 = 0;
  if (z_info->dungeon_wid < z_info->dungeon_hgt) {
    uVar1 = z_info->dungeon_hgt;
  }
  else {
    uVar1 = z_info->dungeon_wid;
  }
  local_a4 = (uint)uVar1;
  local_48 = local_a4 << 1;
  bVar3 = true;
  bVar12 = context->subtype != 0;
  bVar13 = (context->origin).what != SRC_MONSTER;
  local_a5 = bVar13 || bVar12;
  pmVar7 = monster_target_monster(context);
  context->ident = true;
  if ((player->upkeep->arena_level & 1U) != 0) {
    return true;
  }
  _Var4 = loc_is_zero((loc)_perc);
  if (_Var4) {
    if (pmVar7 == (monster *)0x0) {
      if (bVar13 || bVar12) {
        lVar8 = (loc_conflict)cave_find_decoy(cave);
        _Var4 = loc_is_zero((loc)lVar8);
        if ((!_Var4) && (bVar12)) {
          square_destroy_decoy((chunk *)cave,lVar8);
          return true;
        }
        perc = (player->grid).x;
        dis = (player->grid).y;
        _Var4 = square_isno_teleport((chunk *)cave,_perc);
        if ((_Var4) && ((L'\n' < pick || (pick == L'\0')))) {
          msg("Teleportation forbidden!");
          return true;
        }
        _Var4 = player_of_has(player,L'\x1d');
        if (_Var4) {
          equip_learn_flag(player,L'\x1d');
          msg("Teleportation forbidden!");
          return true;
        }
        _Var4 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)")
        ;
        if ((_Var4) && (bVar12)) {
          msg("Teleport resistance!");
          return true;
        }
      }
      else {
        if ((context->origin).what != SRC_MONSTER) {
          __assert_fail("context->origin.what == SRC_MONSTER",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                        ,0xa7e,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
        }
        pmVar10 = cave_monster(cave,(context->origin).which.monster);
        perc = (pmVar10->grid).x;
        dis = (pmVar10->grid).y;
      }
    }
    else {
      perc = (pmVar7->grid).x;
      dis = (pmVar7->grid).y;
    }
  }
  if (wVar6 != L'\0') {
    if (dis < cave->height - dis) {
      local_ac = cave->height - dis;
    }
    else {
      local_ac = dis;
    }
    if (perc < cave->width - perc) {
      local_b0 = cave->width - perc;
    }
    else {
      local_b0 = perc;
    }
    if (local_ac < local_b0) {
      local_b4 = local_b0;
    }
    else {
      local_b4 = local_ac;
    }
    pick = (local_b4 * wVar6) / 100;
  }
  uVar5 = Rand_div(2);
  if (uVar5 == 0) {
    uVar5 = Rand_div(pick / 4);
    uVar5 = -uVar5;
  }
  else {
    uVar5 = Rand_div(pick / 4);
  }
  pick = pick + uVar5;
  wStack_30 = L'\x01';
  do {
    if (cave->height + L'\xffffffff' <= wStack_30) {
      if (uStack_44 == 0) {
        if (bVar13 || bVar12) {
          msg("Failed to find teleport destination!");
        }
        else {
          pmVar10 = cave_monster(cave,(context->origin).which.monster);
          grid_00.x = (pmVar10->grid).x;
          grid_00.y = (pmVar10->grid).y;
          _Var4 = square_isseen((chunk *)cave,grid_00);
          if (_Var4) {
            add_monster_message((monster *)pmVar10,L'2',true);
          }
        }
      }
      else {
        grid.x = Rand_div(uStack_44);
        for (; grid.x != L'\0'; grid.x = grid.x + L'\xffffffff') {
          lVar9 = *(loc *)((long)_current_score + 8);
          mem_free((void *)_current_score);
          _current_score = lVar9;
        }
        if (((local_a5) && (!bVar12)) &&
           (_Var4 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags",
                                 "(PF_PHASEWALK)"), p = player, _Var4)) {
          wVar6 = distance((loc)_perc,*(loc *)_current_score);
          player_add_speed_boost(p,wVar6 + L'\x14');
        }
        type = 0xf;
        if (local_a5) {
          type = 10;
        }
        sound(type);
        monster_swap(_perc,*(loc_conflict *)_current_score);
        if (local_a5) {
          player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
        }
        psVar11 = square((chunk *)cave,*(loc_conflict *)_current_score);
        flag_off(psVar11->info,3,0x12);
        pmVar7 = target_get_monster();
        _Var4 = target_able(pmVar7);
        if (!_Var4) {
          target_set_monster((monster *)0x0);
        }
        handle_stuff(player);
        while (_current_score != (loc)0x0) {
          lVar9 = *(loc *)((long)_current_score + 8);
          mem_free((void *)_current_score);
          _current_score = lVar9;
        }
      }
      return true;
    }
    for (spots._4_4_ = L'\x01'; spots._4_4_ < cave->width + L'\xffffffff';
        spots._4_4_ = spots._4_4_ + L'\x01') {
      lVar9.y = wStack_30;
      lVar9.x = spots._4_4_;
      wVar6 = distance(lVar9,(loc)_perc);
      if (wVar6 - pick < 0) {
        local_b8 = -(wVar6 - pick);
      }
      else {
        local_b8 = wVar6 - pick;
      }
      if ((wVar6 != L'\0') &&
         (lVar8.y = wStack_30, lVar8.x = spots._4_4_,
         _Var4 = has_teleport_destination_prereqs((chunk *)cave,lVar8,local_a5), _Var4)) {
        grid_01.y = wStack_30;
        grid_01.x = spots._4_4_;
        _Var4 = square_isvault((chunk *)cave,grid_01);
        if (_Var4) {
          if (!bVar3) goto LAB_00150d17;
        }
        else {
          if (bVar3) {
            if (z_info->dungeon_wid < z_info->dungeon_hgt) {
              uVar1 = z_info->dungeon_hgt;
            }
            else {
              uVar1 = z_info->dungeon_wid;
            }
            local_bc = (uint)uVar1;
            local_48 = local_bc << 1;
          }
          bVar3 = false;
        }
        if (local_b8 <= local_48) {
          lVar9 = (loc)mem_zalloc(0x10);
          *(ulong *)lVar9 = CONCAT44(wStack_30,spots._4_4_);
          if (local_b8 < local_48) {
            local_48 = local_b8;
            while (_current_score != (loc)0x0) {
              lVar2 = *(loc *)((long)_current_score + 8);
              mem_free((void *)_current_score);
              _current_score = lVar2;
            }
            uStack_44 = 1;
            _current_score = lVar9;
          }
          else {
            *(loc *)((long)lVar9 + 8) = _current_score;
            uStack_44 = uStack_44 + 1;
            _current_score = lVar9;
          }
        }
      }
LAB_00150d17:
    }
    wStack_30 = wStack_30 + L'\x01';
  } while( true );
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool hostile = context->subtype ? true : false;
	bool is_player = (context->origin.what != SRC_MONSTER || hostile);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && hostile) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for teleport resistance */
		if (player_has(player, PF_PHASEWALK) && hostile) {
			msg("Teleport resistance!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Check for specialty speed boost on friendly teleports */
	if (is_player && !hostile && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, spots->grid));
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}